

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMGBndry.cpp
# Opt level: O1

void __thiscall
amrex::MLMGBndry::setLOBndryConds
          (MLMGBndry *this,
          Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
          *lo,Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              *hi,int ratio,RealVect *a_loc)

{
  int iVar1;
  int iVar2;
  pointer paVar3;
  pointer pVVar4;
  long *plVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  GpuArray<int,_3U> local_118;
  BCTuple bct;
  undefined1 local_e8 [16];
  double local_d8;
  undefined1 local_c8 [16];
  double local_b8;
  FabSetIter fsi;
  Box local_4c;
  
  local_118.arr._0_8_ =
       (ulong)(byte)(this->super_InterpBndryData).super_BndryData.geom.super_CoordSys.field_0x52 <<
       0x20 | (ulong)(byte)(this->super_InterpBndryData).super_BndryData.geom.super_CoordSys.
                           field_0x51;
  local_118.arr[2] =
       (int)(byte)(this->super_InterpBndryData).super_BndryData.geom.super_CoordSys.field_0x53;
  MFIter::MFIter(&fsi.super_MFIter,
                 (FabArrayBase *)
                 (this->super_InterpBndryData).super_BndryData.super_BndryRegister.bndry,'\0');
  if (fsi.super_MFIter.currentIndex < fsi.super_MFIter.endIndex) {
    do {
      piVar7 = &fsi.super_MFIter.currentIndex;
      BATransformer::operator()
                (&local_4c,
                 &(this->super_InterpBndryData).super_BndryData.super_BndryRegister.grids.m_bat,
                 (Box *)((long)((fsi.super_MFIter.index_map)->
                               super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[fsi.super_MFIter.currentIndex] *
                         0x1c + *(long *)&(((this->super_InterpBndryData).super_BndryData.
                                            super_BndryRegister.grids.m_ref.
                                            super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->m_abox).
                                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                          ._M_impl.super__Vector_impl_data));
      piVar6 = piVar7;
      if (fsi.super_MFIter.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar6 = ((fsi.super_MFIter.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + fsi.super_MFIter.currentIndex;
      }
      iVar1 = *piVar6;
      paVar3 = (this->super_InterpBndryData).super_BndryData.bcloc.m_data.
               super_vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>.
               super__Vector_base<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (fsi.super_MFIter.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar7 = ((fsi.super_MFIter.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + fsi.super_MFIter.currentIndex;
      }
      if (0 < (this->super_InterpBndryData).super_BndryData.m_ncomp) {
        iVar2 = *piVar7;
        pVVar4 = (this->super_InterpBndryData).super_BndryData.bcond.m_data.
                 super_vector<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar9 = 0;
        do {
          bct._M_elems[0].bctype = -1;
          bct._M_elems[1].bctype = -1;
          bct._M_elems[2].bctype = -1;
          bct._M_elems[3].bctype = -1;
          bct._M_elems[4].bctype = -1;
          bct._M_elems[5].bctype = -1;
          local_b8 = 0.0;
          local_c8 = (undefined1  [16])0x0;
          local_d8 = 0.0;
          local_e8 = (undefined1  [16])0x0;
          setBoxBC(paVar3 + iVar1,&bct,&local_4c,
                   &(this->super_InterpBndryData).super_BndryData.geom.domain,
                   (lo->
                   super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                   ).
                   super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar9,
                   (hi->
                   super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                   ).
                   super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar9,
                   (this->super_InterpBndryData).super_BndryData.geom.super_CoordSys.dx,ratio,a_loc,
                   (Array<Real,_3> *)local_c8,(Array<Real,_3> *)local_e8,&local_118);
          plVar5 = *(long **)&pVVar4[iVar2].
                              super_vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>
          ;
          lVar8 = 0;
          do {
            *(int *)(*plVar5 + lVar9 * 4) = bct._M_elems[lVar8].bctype;
            lVar8 = lVar8 + 1;
            plVar5 = plVar5 + 3;
          } while (lVar8 != 6);
          lVar9 = lVar9 + 1;
        } while (lVar9 < (this->super_InterpBndryData).super_BndryData.m_ncomp);
      }
      MFIter::operator++(&fsi.super_MFIter);
    } while (fsi.super_MFIter.currentIndex < fsi.super_MFIter.endIndex);
  }
  MFIter::~MFIter(&fsi.super_MFIter);
  return;
}

Assistant:

void
MLMGBndry::setLOBndryConds (const Vector<Array<LinOpBCType,AMREX_SPACEDIM> >& lo,
                            const Vector<Array<LinOpBCType,AMREX_SPACEDIM> >& hi,
                            int ratio, const RealVect& a_loc)
{
    const BoxArray& ba     = boxes();
    const Real*     dx     = geom.CellSize();
    const Box&      domain = geom.Domain();
    const GpuArray<int,AMREX_SPACEDIM>& is_periodic = geom.isPeriodicArray();

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
    for (FabSetIter fsi(bndry[Orientation(0,Orientation::low)]); fsi.isValid(); ++fsi)
    {
        const int                  i     = fsi.index();
        const Box&                 grd   = ba[i];
        RealTuple&                 bloc  = bcloc[fsi];
        Vector< Vector<BoundCond> >& bctag = bcond[fsi];

        for (int icomp = 0; icomp < nComp(); ++icomp) {
            BCTuple bct;
            setBoxBC(bloc, bct, grd, domain, lo[icomp], hi[icomp], dx, ratio,
                     a_loc, {{AMREX_D_DECL(0.,0.,0.)}}, {{AMREX_D_DECL(0.,0.,0.)}},
                     is_periodic);
            for (int idim = 0; idim < 2*AMREX_SPACEDIM; ++idim) {
                bctag[idim][icomp] = bct[idim];
            }
        }
    }
}